

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O1

void duckdb::TupleDataStructScatter
               (Vector *source,TupleDataVectorFormat *source_format,SelectionVector *append_sel,
               idx_t append_count,TupleDataLayout *layout,Vector *row_locations,
               Vector *heap_locations,idx_t col_idx,UnifiedVectorFormat *dummy_arg,
               vector<duckdb::TupleDataScatterFunction,_true> *child_functions)

{
  byte *pbVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  value_type vVar6;
  _Hash_node_base *p_Var7;
  byte bVar8;
  const_reference pvVar9;
  pointer puVar10;
  __node_base_ptr p_Var11;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  const_reference this_00;
  type pVVar12;
  const_reference pvVar13;
  const_reference pvVar14;
  idx_t iVar15;
  __node_base_ptr p_Var16;
  idx_t iVar17;
  __hash_code __code;
  size_type __n;
  LogicalType local_b0;
  Vector struct_row_locations;
  
  pdVar2 = row_locations->data;
  if (append_count != 0 &&
      (source_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
      (unsigned_long *)0x0) {
    pSVar3 = (source_format->unified).sel;
    bVar8 = (byte)col_idx & 7;
    iVar15 = 0;
    do {
      iVar17 = iVar15;
      if (append_sel->sel_vector != (sel_t *)0x0) {
        iVar17 = (idx_t)append_sel->sel_vector[iVar15];
      }
      psVar4 = pSVar3->sel_vector;
      if (psVar4 != (sel_t *)0x0) {
        iVar17 = (idx_t)psVar4[iVar17];
      }
      puVar5 = (source_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[iVar17 >> 6] >> (iVar17 & 0x3f) & 1) == 0)) {
        pbVar1 = (byte *)(*(long *)(pdVar2 + iVar15 * 8) + (col_idx >> 3));
        *pbVar1 = *pbVar1 & (-2 << bVar8 | 0xfeU >> 8 - bVar8);
      }
      iVar15 = iVar15 + 1;
    } while (append_count != iVar15);
  }
  LogicalType::LogicalType(&local_b0,POINTER);
  Vector::Vector(&struct_row_locations,&local_b0,append_count);
  LogicalType::~LogicalType(&local_b0);
  pvVar9 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_idx);
  if (append_count != 0) {
    vVar6 = *pvVar9;
    iVar15 = 0;
    do {
      *(value_type *)(struct_row_locations.data + iVar15 * 8) =
           *(long *)(pdVar2 + iVar15 * 8) + vVar6;
      iVar15 = iVar15 + 1;
    } while (append_count != iVar15);
  }
  puVar10 = unique_ptr<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>,_std::default_delete<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_>,_true>
            ::operator->(&layout->struct_layouts);
  p_Var11 = (puVar10->_M_h)._M_buckets[col_idx % (puVar10->_M_h)._M_bucket_count];
  for (p_Var16 = p_Var11->_M_nxt; p_Var16[1]._M_nxt != (_Hash_node_base *)col_idx;
      p_Var16 = p_Var16->_M_nxt) {
    p_Var11 = p_Var16;
  }
  p_Var7 = p_Var11->_M_nxt;
  this = StructVector::GetEntries(source);
  InitializeValidityMask
            ((data_ptr_t *)struct_row_locations.data,append_count,
             ((long)p_Var7[3]._M_nxt - (long)p_Var7[2]._M_nxt >> 3) * -0x5555555555555555 + 7U >> 3)
  ;
  if (p_Var7[3]._M_nxt != p_Var7[2]._M_nxt) {
    __n = 0;
    do {
      this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::operator[](this,__n);
      pVVar12 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this_00);
      pvVar13 = vector<duckdb::TupleDataVectorFormat,_true>::operator[]
                          (&source_format->children,__n);
      pvVar14 = vector<duckdb::TupleDataScatterFunction,_true>::operator[](child_functions,__n);
      (*pvVar14->function)
                (pVVar12,pvVar13,append_sel,append_count,(TupleDataLayout *)(p_Var7 + 2),
                 &struct_row_locations,heap_locations,__n,dummy_arg,&pvVar14->child_functions);
      __n = __n + 1;
    } while (__n < (ulong)(((long)p_Var7[3]._M_nxt - (long)p_Var7[2]._M_nxt >> 3) *
                          -0x5555555555555555));
  }
  if (struct_row_locations.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (struct_row_locations.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (struct_row_locations.buffer.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (struct_row_locations.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (struct_row_locations.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
      internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (struct_row_locations.validity.super_TemplatedValidityMask<unsigned_long>.
               validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&struct_row_locations.type);
  return;
}

Assistant:

static void TupleDataStructScatter(const Vector &source, const TupleDataVectorFormat &source_format,
                                   const SelectionVector &append_sel, const idx_t append_count,
                                   const TupleDataLayout &layout, const Vector &row_locations, Vector &heap_locations,
                                   const idx_t col_idx, const UnifiedVectorFormat &dummy_arg,
                                   const vector<TupleDataScatterFunction> &child_functions) {
	// Source
	const auto &source_data = source_format.unified;
	const auto &source_sel = *source_data.sel;
	const auto &validity = source_data.validity;

	// Target
	const auto target_locations = FlatVector::GetData<data_ptr_t>(row_locations);

	// Precompute mask indexes
	idx_t entry_idx;
	idx_t idx_in_entry;
	ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

	// Set validity of the STRUCT in this layout
	if (!validity.AllValid()) {
		for (idx_t i = 0; i < append_count; i++) {
			const auto source_idx = source_sel.get_index(append_sel.get_index(i));
			if (!validity.RowIsValid(source_idx)) {
				ValidityBytes(target_locations[i], layout.ColumnCount()).SetInvalidUnsafe(entry_idx, idx_in_entry);
			}
		}
	}

	// Create a Vector of pointers to the TupleDataLayout of the STRUCT
	Vector struct_row_locations(LogicalType::POINTER, append_count);
	auto struct_target_locations = FlatVector::GetData<data_ptr_t>(struct_row_locations);
	const auto offset_in_row = layout.GetOffsets()[col_idx];
	for (idx_t i = 0; i < append_count; i++) {
		struct_target_locations[i] = target_locations[i] + offset_in_row;
	}

	const auto &struct_layout = layout.GetStructLayout(col_idx);
	auto &struct_sources = StructVector::GetEntries(source);
	D_ASSERT(struct_layout.ColumnCount() == struct_sources.size());

	// Set the validity of the entries within the STRUCTs
	InitializeValidityMask(struct_target_locations, append_count,
	                       ValidityBytes::SizeInBytes(struct_layout.ColumnCount()));

	// Recurse through the struct children
	for (idx_t struct_col_idx = 0; struct_col_idx < struct_layout.ColumnCount(); struct_col_idx++) {
		auto &struct_source = *struct_sources[struct_col_idx];
		const auto &struct_source_format = source_format.children[struct_col_idx];
		const auto &struct_scatter_function = child_functions[struct_col_idx];
		struct_scatter_function.function(struct_source, struct_source_format, append_sel, append_count, struct_layout,
		                                 struct_row_locations, heap_locations, struct_col_idx, dummy_arg,
		                                 struct_scatter_function.child_functions);
	}
}